

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O1

FieldFamily
google::protobuf::compiler::cpp::MessageLayoutHelper::GetFieldFamily
          (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  byte bVar1;
  FieldFamily FVar2;
  Nonnull<const_char_*> pcVar3;
  bool bVar4;
  
  bVar1 = field->field_0x1;
  bVar4 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar4) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar4,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
        FVar2 = STRING;
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        FVar2 = MESSAGE;
      }
      else {
        bVar4 = CanInitializeByZeroing(field,options,scc_analyzer);
        FVar2 = OTHER - bVar4;
      }
    }
    else {
      bVar4 = ShouldSplit(field,options);
      FVar2 = (uint)bVar4 << 2;
    }
    return FVar2;
  }
  GetFieldFamily();
}

Assistant:

MessageLayoutHelper::FieldFamily MessageLayoutHelper::GetFieldFamily(
    const FieldDescriptor* field, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) {
  if (field->is_repeated()) {
    return ShouldSplit(field, options) ? OTHER : REPEATED;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return STRING;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return MESSAGE;
  } else if (CanInitializeByZeroing(field, options, scc_analyzer)) {
    return ZERO_INITIALIZABLE;
  } else {
    return OTHER;
  }
}